

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_Error.cpp
# Opt level: O2

size_t __thiscall
axl::err::Error::formatStringError_va(Error *this,char *formatString,axl_va_list *va)

{
  size_t sVar1;
  String string;
  char buffer [256];
  axl_va_list local_168;
  StringRef local_148;
  undefined1 local_128 [264];
  
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)&local_148,BufKind_Exclusive,
             local_128,0x100);
  local_168._0_8_ = *(undefined8 *)va;
  local_168._8_8_ = *(undefined8 *)&va->field_0x8;
  local_168._16_8_ = *(undefined8 *)&va->field_0x10;
  local_168.m_isInitialized = true;
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::format_va
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)&local_148,formatString,
             &local_168);
  if (local_168.m_isInitialized == true) {
    local_168.m_isInitialized = false;
  }
  sVar1 = createStringError(this,&local_148);
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_148);
  return sVar1;
}

Assistant:

size_t
Error::formatStringError_va(
	const char* formatString,
	axl_va_list va
) {
	char buffer[256];
	sl::String string(rc::BufKind_Stack, buffer, sizeof(buffer));
	string.format_va(formatString, va);
	return createStringError(string);
}